

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O2

int __thiscall UdpBitDht::tick(UdpBitDht *this)

{
  int iVar1;
  int iVar2;
  uint local_454;
  pthread_mutex_t *local_450;
  sockaddr_in toAddr;
  char data [1024];
  
  local_450 = (pthread_mutex_t *)&this->dhtMtx;
  pthread_mutex_lock(local_450);
  iVar2 = 100;
  while( true ) {
    local_454 = 0x400;
    if (iVar2 == 0) break;
    iVar1 = bdNode::outgoingMsg(&this->mBitDhtManager->super_bdNode,&toAddr,data,(int *)&local_454);
    if (iVar1 == 0) break;
    this->mWriteBytes = this->mWriteBytes + local_454;
    (*(this->super_UdpSubReceiver).super_UdpReceiver._vptr_UdpReceiver[4])
              (this,data,(ulong)local_454,&toAddr,0x40);
    iVar2 = iVar2 + -1;
  }
  pthread_mutex_unlock(local_450);
  return (int)(iVar2 == 0);
}

Assistant:

int UdpBitDht::tick() {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	/* pass on messages from the node */
	int i = 0;
	char data[BITDHT_MAX_PKTSIZE];
	struct sockaddr_in toAddr;
	int size = BITDHT_MAX_PKTSIZE;

	while((i < MAX_MSG_PER_TICK) && (mBitDhtManager->outgoingMsg(&toAddr, data, &size))) {
#ifdef DEBUG_UDP_BITDHT 
		std::cerr << "UdpBitDht::tick() outgoing msg(" << size << ") to " << toAddr;
		std::cerr << std::endl;
#endif

		mWriteBytes += size;
		sendPkt(data, size, toAddr, BITDHT_TTL);

		// iterate
		i++;
		size = BITDHT_MAX_PKTSIZE; // reset msg size!
	}

	if (i == MAX_MSG_PER_TICK)
		return 1; /* keep on ticking */
	return 0;
}